

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_feature_tests.cpp
# Opt level: O0

void __thiscall
iu_FileSystem_x_iutest_x_PathPrintTo_Test::Body(iu_FileSystem_x_iutest_x_PathPrintTo_Test *this)

{
  Fixed *fixed;
  AssertionHelper local_290;
  string local_260;
  Fixed local_240;
  path local_a8;
  undefined1 local_80 [8];
  path v;
  PrintToLogChecker ck;
  iu_FileSystem_x_iutest_x_PathPrintTo_Test *this_local;
  
  PrintToLogChecker::PrintToLogChecker((PrintToLogChecker *)&v._M_cmpts,"/cxx_feature_tests.cpp");
  std::filesystem::__cxx11::path::path<char[96],std::filesystem::__cxx11::path>
            (&local_a8,
             (char (*) [96])
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
             ,auto_format);
  std::filesystem::absolute((path *)local_80);
  std::filesystem::__cxx11::path::~path(&local_a8);
  memset(&local_240,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_240);
  iutest::PrintToString<std::filesystem::__cxx11::path>(&local_260,(path *)local_80);
  fixed = iutest::AssertionHelper::Fixed::operator<<(&local_240,&local_260);
  iutest::AssertionHelper::AssertionHelper
            (&local_290,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
             ,0x10f,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_290,fixed);
  iutest::AssertionHelper::~AssertionHelper(&local_290);
  std::__cxx11::string::~string((string *)&local_260);
  iutest::AssertionHelper::Fixed::~Fixed(&local_240);
  std::filesystem::__cxx11::path::~path((path *)local_80);
  PrintToLogChecker::~PrintToLogChecker((PrintToLogChecker *)&v._M_cmpts);
  return;
}

Assistant:

IUTEST(FileSystem, PathPrintTo)
{
    {
        PrintToLogChecker ck("/cxx_feature_tests.cpp");
        ::std::filesystem::path v = ::std::filesystem::absolute(__FILE__);
        IUTEST_SUCCEED() << ::iutest::PrintToString(v);
    }
}